

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

bool __thiscall CppJieba::HMMSegment::_decodeOne(HMMSegment *this,string *str,uint16_t *res)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  value_type *in_RDX;
  Unicode ui16;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *vec;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_38;
  value_type *local_20;
  byte local_1;
  
  vec = &local_38;
  local_20 = in_RDX;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x144ba1);
  bVar1 = TransCode::decode((string *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                            vec);
  if ((bVar1) &&
     (sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_38),
     sVar2 == 1)) {
    pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](&local_38,0);
    *local_20 = *pvVar3;
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(in_stack_ffffffffffffffc0);
  return (bool)(local_1 & 1);
}

Assistant:

bool _decodeOne(const string& str, uint16_t& res)
            {
                Unicode ui16;
                if(!TransCode::decode(str, ui16) || ui16.size() != 1)
                {
                    return false;
                }
                res = ui16[0];
                return true;
            }